

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_oper.cpp
# Opt level: O2

void __thiscall FParser::OPand_bin(FParser *this,svalue_t *result,int start,int n,int stop)

{
  uint uVar1;
  uint uVar2;
  svalue_t right;
  svalue_t left;
  
  left.string.Chars = FString::NullString.Nothing;
  right.type = 1;
  left.value.i = 0;
  FString::NullString.RefCount = FString::NullString.RefCount + 2;
  right.string.Chars = FString::NullString.Nothing;
  right.value.i = 0;
  left.type = right.type;
  EvaluateExpression(this,&left,start,n + -1);
  EvaluateExpression(this,&right,n + 1,stop);
  result->type = 1;
  uVar1 = intvalue(&left);
  uVar2 = intvalue(&right);
  (result->value).i = uVar2 & uVar1;
  FString::~FString(&right.string);
  FString::~FString(&left.string);
  return;
}

Assistant:

void FParser::OPand_bin(svalue_t &result, int start, int n, int stop)
{
	svalue_t left, right;
	
	evaluate_leftnright(start, n, stop);
	
	result.type = svt_int;
	result.value.i = intvalue(left) & intvalue(right);
}